

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::PRE::MakePropertySymLiveOnBackEdges
          (PRE *this,PropertySym *propertySym,Loop *loop,Value *valueToAdd)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppFVar4;
  BasicBlock *pBVar5;
  BasicBlock *blockPred;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *loopHeader;
  Value *valueToAdd_local;
  Loop *loop_local;
  PropertySym *propertySym_local;
  PRE *this_local;
  
  __iter.current = (NodeBase *)Loop::GetHeadBlock(loop);
  this_01 = &BasicBlock::GetPredList((BasicBlock *)__iter.current)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = __edge;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&__edge);
    pBVar5 = FlowEdge::GetPred(*ppFVar4);
    if (pBVar5 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x461b,"(blockPred)","blockPred");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = Loop::IsDescendentOrSelf(loop,pBVar5->loop);
    if (bVar2) {
      GlobOptBlockData::SetValue(&pBVar5->globOptData,valueToAdd,&propertySym->super_Sym);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pBVar5->globOptData).liveFields,(propertySym->super_Sym).m_id);
    }
  }
  return;
}

Assistant:

void
GlobOpt::PRE::MakePropertySymLiveOnBackEdges(PropertySym * propertySym, Loop * loop, Value * valueToAdd)
{
    BasicBlock * loopHeader = loop->GetHeadBlock();
    FOREACH_PREDECESSOR_BLOCK(blockPred, loopHeader)
    {
        if (!loop->IsDescendentOrSelf(blockPred->loop))
        {
            // Not a loop back-edge
            continue;
        }

        // Insert it in the value table
        blockPred->globOptData.SetValue(valueToAdd, propertySym);

        // Make it a live field
        blockPred->globOptData.liveFields->Set(propertySym->m_id);
    } NEXT_PREDECESSOR_BLOCK;
}